

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O1

int __thiscall
TPZSkylMatrix<std::complex<double>_>::PutVal
          (TPZSkylMatrix<std::complex<double>_> *this,int64_t r,int64_t c,complex<double> *value)

{
  complex<double> *pcVar1;
  complex<double> **ppcVar2;
  undefined8 uVar3;
  long lVar4;
  double dVar5;
  
  lVar4 = r - c;
  if (lVar4 == 0 || r < c) {
    lVar4 = -(r - c);
    r = c;
  }
  ppcVar2 = (this->fElem).fStore;
  if ((lVar4 < (long)ppcVar2[r + 1] - (long)ppcVar2[r] >> 4) ||
     (dVar5 = cabs(*(double *)value->_M_value), ABS(dVar5) < 1e-12)) {
    ppcVar2 = (this->fElem).fStore;
    if ((long)ppcVar2[r + 1] - (long)ppcVar2[r] >> 4 <= lVar4) {
      return 1;
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"TPZSkylMatrix::PutVal Size",0x1a);
    std::ostream::_M_insert<long>((long)&std::cout);
    std::ostream::flush();
    TPZMatrix<std::complex<double>_>::Error
              ("virtual int TPZSkylMatrix<std::complex<double>>::PutVal(const int64_t, const int64_t, const TVar &) [TVar = std::complex<double>]"
               ,"Index out of range");
  }
  uVar3 = *(undefined8 *)(value->_M_value + 8);
  pcVar1 = (this->fElem).fStore[r] + lVar4;
  *(undefined8 *)pcVar1->_M_value = *(undefined8 *)value->_M_value;
  *(undefined8 *)(pcVar1->_M_value + 8) = uVar3;
  (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fDecomposed = '\0';
  return 1;
}

Assistant:

int
TPZSkylMatrix<TVar>::PutVal(const int64_t r,const int64_t c,const TVar & value )
{
	// inicializando row e col para trabalhar com a triangular superior
	int64_t row(r),col(c);
	if ( row > col )
		this->Swap( &row, &col );
	
	// Indice do vetor coluna.
	int64_t index = col - row;
	// Se precisar redimensionar o vetor.
	//EBORIN: Do we really need to check this?
	if ( index >= Size(col) && !IsZero(value)) {
		cout << "TPZSkylMatrix::PutVal Size" << Size(col);
		cout.flush();
		TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__,"Index out of range");
	} else if(index >= Size(col)) return 1;
	fElem[col][index] = value;
	//  delete[]newVet;
	this->fDecomposed = 0;
	return( 1 );
}